

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

void __thiscall glslang::TIntermBinary::updatePrecision(TIntermBinary *this)

{
  TPrecisionQualifier TVar1;
  ulong uVar2;
  TIntermTyped *pTVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TPrecisionQualifier *pTVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TPrecisionQualifier local_18;
  TPrecisionQualifier local_14;
  TIntermBinary *local_10;
  TIntermBinary *this_local;
  
  local_10 = this;
  iVar4 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x20])();
  if (((iVar4 == 8) ||
      (iVar4 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode[0x20])(), iVar4 == 9)) ||
     (iVar4 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x20])(), iVar4 == 1)) {
    if (((this->super_TIntermOperator).op == EOpRightShift) ||
       ((this->super_TIntermOperator).op == EOpLeftShift)) {
      iVar4 = (*(this->left->super_TIntermNode)._vptr_TIntermNode[0x21])();
      uVar2 = *(ulong *)(CONCAT44(extraout_var,iVar4) + 8);
      iVar4 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x21])();
      *(ulong *)(CONCAT44(extraout_var_00,iVar4) + 8) =
           *(ulong *)(CONCAT44(extraout_var_00,iVar4) + 8) & 0xfffffffff1ffffff |
           (ulong)((uint)(uVar2 >> 0x19) & 7) << 0x19;
    }
    else {
      iVar4 = (*(this->right->super_TIntermNode)._vptr_TIntermNode[0x21])();
      local_14 = (TPrecisionQualifier)(*(ulong *)(CONCAT44(extraout_var_01,iVar4) + 8) >> 0x19) & 7;
      iVar4 = (*(this->left->super_TIntermNode)._vptr_TIntermNode[0x21])();
      local_18 = (TPrecisionQualifier)(*(ulong *)(CONCAT44(extraout_var_02,iVar4) + 8) >> 0x19) & 7;
      pTVar5 = std::max<glslang::TPrecisionQualifier>(&local_14,&local_18);
      TVar1 = *pTVar5;
      iVar4 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x21])();
      *(ulong *)(CONCAT44(extraout_var_03,iVar4) + 8) =
           *(ulong *)(CONCAT44(extraout_var_03,iVar4) + 8) & 0xfffffffff1ffffff |
           ((ulong)TVar1 & 7) << 0x19;
      iVar4 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x21])();
      if ((*(ulong *)(CONCAT44(extraout_var_04,iVar4) + 8) >> 0x19 & 7) != 0) {
        pTVar3 = this->left;
        iVar4 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x21])();
        (*(pTVar3->super_TIntermNode)._vptr_TIntermNode[0x25])
                  (pTVar3,(ulong)((uint)(*(ulong *)(CONCAT44(extraout_var_05,iVar4) + 8) >> 0x19) &
                                 7));
        pTVar3 = this->right;
        iVar4 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x21])();
        (*(pTVar3->super_TIntermNode)._vptr_TIntermNode[0x25])
                  (pTVar3,(ulong)((uint)(*(ulong *)(CONCAT44(extraout_var_06,iVar4) + 8) >> 0x19) &
                                 7));
      }
    }
  }
  return;
}

Assistant:

void TIntermBinary::updatePrecision()
{
     if (getBasicType() == EbtInt || getBasicType() == EbtUint ||
         getBasicType() == EbtFloat) {
       if (op == EOpRightShift || op == EOpLeftShift) {
         // For shifts get precision from left side only and thus no need to propagate
         getQualifier().precision = left->getQualifier().precision;
       } else {
         getQualifier().precision = std::max(right->getQualifier().precision, left->getQualifier().precision);
         if (getQualifier().precision != EpqNone) {
           left->propagatePrecision(getQualifier().precision);
           right->propagatePrecision(getQualifier().precision);
         }
       }
    }
}